

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintShortRepeatedField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  TextGenerator *this_00;
  int local_5c;
  undefined1 auStack_58 [4];
  int i;
  StringPiece local_48;
  int local_34;
  TextGenerator *pTStack_30;
  int size;
  TextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  pTStack_30 = generator;
  generator_local = (TextGenerator *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  local_34 = Reflection::FieldSize(reflection,message,field);
  PrintFieldName(this,(Message *)reflection_local,-1,local_34,(Reflection *)field_local,
                 (FieldDescriptor *)generator_local,pTStack_30);
  this_00 = pTStack_30;
  stringpiece_internal::StringPiece::StringPiece(&local_48,": ");
  stringpiece_internal::StringPiece::StringPiece((StringPiece *)auStack_58,"[");
  TextGenerator::PrintMaybeWithMarker(this_00,local_48,_auStack_58);
  for (local_5c = 0; local_5c < local_34; local_5c = local_5c + 1) {
    if (0 < local_5c) {
      BaseTextGenerator::PrintLiteral<3ul>
                (&pTStack_30->super_BaseTextGenerator,(char (*) [3])0x7920f5);
    }
    PrintFieldValue(this,(Message *)reflection_local,(Reflection *)field_local,
                    (FieldDescriptor *)generator_local,local_5c,pTStack_30);
  }
  if ((this->single_line_mode_ & 1U) == 0) {
    BaseTextGenerator::PrintLiteral<3ul>
              (&pTStack_30->super_BaseTextGenerator,(char (*) [3])0x77e483);
  }
  else {
    BaseTextGenerator::PrintLiteral<3ul>(&pTStack_30->super_BaseTextGenerator,(char (*) [3])"] ");
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintShortRepeatedField(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, TextGenerator* generator) const {
  // Print primitive repeated field in short form.
  int size = reflection->FieldSize(message, field);
  PrintFieldName(message, /*field_index=*/-1, /*field_count=*/size, reflection,
                 field, generator);
  generator->PrintMaybeWithMarker(": ", "[");
  for (int i = 0; i < size; i++) {
    if (i > 0) generator->PrintLiteral(", ");
    PrintFieldValue(message, reflection, field, i, generator);
  }
  if (single_line_mode_) {
    generator->PrintLiteral("] ");
  } else {
    generator->PrintLiteral("]\n");
  }
}